

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

void QtPrivate::QDebugStreamOperatorForType<QDateTime,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  Data local_20;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.data = (ShortData)dbg->stream;
  *(int *)&local_20.d[1].m_msecs = (int)local_20.d[1].m_msecs + 1;
  ::operator<<((Stream *)&local_18,(QDateTime *)&local_20.data);
  QDebug::~QDebug(&local_18);
  QDebug::~QDebug((QDebug *)&local_20.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }